

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O3

void handle_partial_writes
               (cio_buffered_stream *buffered_stream,cio_io_stream *io_stream,
               cio_write_buffer *buffer,size_t bytes_transferred)

{
  cio_write_buffer *pcVar1;
  cio_write_buffer *pcVar2;
  size_t *psVar3;
  anon_union_16_2_70f96463_for_data *paVar4;
  ulong uVar5;
  cio_error cVar6;
  ulong uVar7;
  cio_write_buffer *pcVar8;
  cio_write_buffer *pcVar9;
  long lVar10;
  long lVar11;
  cio_write_buffer *pcVar12;
  
  pcVar1 = &buffered_stream->wbh;
  (buffered_stream->wbh).prev = pcVar1;
  (buffered_stream->wbh).next = pcVar1;
  (buffered_stream->wbh).data.head.q_len = 0;
  (buffered_stream->wbh).data.element.length = 0;
  buffered_stream->original_wbh = buffer;
  pcVar8 = buffer;
  do {
    uVar7 = bytes_transferred;
    pcVar8 = pcVar8->next;
    uVar5 = (pcVar8->data).element.length;
    bytes_transferred = uVar7 - uVar5;
  } while (uVar5 <= uVar7);
  pcVar2 = &buffered_stream->write_buffer;
  (buffered_stream->write_buffer).data.head.q_len = uVar7 + (pcVar8->data).head.q_len;
  (buffered_stream->write_buffer).data.element.length = uVar5 - uVar7;
  (buffered_stream->write_buffer).next = pcVar1;
  (buffered_stream->write_buffer).prev = pcVar1;
  (buffered_stream->wbh).next = pcVar2;
  (buffered_stream->wbh).prev = pcVar2;
  (buffered_stream->wbh).data.head.q_len = 1;
  (buffered_stream->wbh).data.element.length = uVar5 - uVar7;
  if (buffer->next != buffer) {
    pcVar9 = pcVar8->next;
    if (pcVar8->next == buffer) {
      pcVar9 = buffer->next;
    }
    pcVar8 = buffer->prev;
    if (pcVar9 == buffer) {
      lVar10 = 0;
      lVar11 = 0;
    }
    else {
      lVar11 = 0;
      lVar10 = 0;
      pcVar12 = pcVar9;
      do {
        lVar10 = lVar10 + (pcVar12->data).element.length;
        lVar11 = lVar11 + 1;
        pcVar12 = pcVar12->next;
      } while (pcVar12 != buffer);
    }
    pcVar12 = pcVar9->prev;
    pcVar12->next = buffer;
    buffer->prev = pcVar12;
    (buffer->data).head.q_len = (buffer->data).head.q_len - lVar11;
    psVar3 = &(buffer->data).element.length;
    *psVar3 = *psVar3 - lVar10;
    pcVar8->next = pcVar1;
    (buffered_stream->wbh).prev = pcVar8;
    (buffered_stream->write_buffer).next = pcVar9;
    pcVar9->prev = pcVar2;
    paVar4 = &(buffered_stream->wbh).data;
    (paVar4->head).q_len = (paVar4->head).q_len + lVar11;
    psVar3 = &(buffered_stream->wbh).data.element.length;
    *psVar3 = *psVar3 + lVar10;
  }
  cVar6 = (*buffered_stream->stream->write_some)(io_stream,pcVar1,handle_write,buffered_stream);
  if (cVar6 != CIO_SUCCESS) {
    (*buffered_stream->write_handler)(buffered_stream,buffered_stream->write_handler_context,cVar6);
    return;
  }
  return;
}

Assistant:

static void handle_partial_writes(struct cio_buffered_stream *buffered_stream, struct cio_io_stream *io_stream, struct cio_write_buffer *buffer, size_t bytes_transferred)
{
	cio_write_buffer_head_init(&buffered_stream->wbh);
	buffered_stream->original_wbh = buffer;

	buffer = buffer->next;
	while (!buffer_partially_written(buffer, bytes_transferred)) {
		bytes_transferred -= buffer->data.element.length;
		buffer = buffer->next;
	}

	const void *new_data = &((const uint8_t *)buffer->data.element.const_data)[bytes_transferred];
	size_t new_length = buffer->data.element.length - bytes_transferred;
	cio_write_buffer_const_element_init(&buffered_stream->write_buffer, new_data, new_length);
	cio_write_buffer_queue_head(&buffered_stream->wbh, &buffered_stream->write_buffer);

	cio_write_buffer_split_and_append(&buffered_stream->wbh, buffered_stream->original_wbh, buffer->next);

	enum cio_error err = buffered_stream->stream->write_some(io_stream, &buffered_stream->wbh, handle_write, buffered_stream);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		buffered_stream->write_handler(buffered_stream, buffered_stream->write_handler_context, err);
	}
}